

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_epoch.h
# Opt level: O0

bool __thiscall
FASTER::core::LightEpoch::EpochAction::TrySwap
          (EpochAction *this,uint64_t expected_epoch,uint64_t prior_epoch,callback_t new_callback,
          IAsyncContext *new_context)

{
  _func_void_IAsyncContext_ptr *p_Var1;
  IAsyncContext *pIVar2;
  bool bVar3;
  __int_type _Var4;
  IAsyncContext *existing_context;
  callback_t existing_callback;
  bool retval;
  IAsyncContext *new_context_local;
  callback_t new_callback_local;
  uint64_t prior_epoch_local;
  uint64_t expected_epoch_local;
  EpochAction *this_local;
  memory_order local_70;
  int local_6c;
  memory_order __b;
  EpochAction *local_60;
  undefined4 local_54;
  undefined8 local_50;
  uint64_t *local_48;
  EpochAction *local_40;
  bool local_31;
  undefined8 local_30;
  memory_order local_28;
  undefined4 local_24;
  undefined8 local_20;
  uint64_t *local_18;
  EpochAction *local_10;
  
  local_50 = 0xfffffffffffffffe;
  local_54 = 5;
  prior_epoch_local = expected_epoch;
  expected_epoch_local = (uint64_t)this;
  local_48 = &prior_epoch_local;
  local_40 = this;
  local_28 = std::__cmpexch_failure_order(memory_order_seq_cst);
  local_20 = 0xfffffffffffffffe;
  local_24 = 5;
  local_30 = 0xfffffffffffffffe;
  switch(0x10a407) {
  default:
    if (local_28 - memory_order_consume < 2) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else if (local_28 == memory_order_seq_cst) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    break;
  case 2:
    if (local_28 - memory_order_consume < 2) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else if (local_28 == memory_order_seq_cst) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    break;
  case 3:
    if (local_28 - memory_order_consume < 2) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else if (local_28 == memory_order_seq_cst) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    break;
  case 4:
    if (local_28 - memory_order_consume < 2) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else if (local_28 == memory_order_seq_cst) {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
    else {
      LOCK();
      _Var4 = (this->epoch).super___atomic_base<unsigned_long>._M_i;
      local_31 = prior_epoch_local == _Var4;
      if (local_31) {
        (this->epoch).super___atomic_base<unsigned_long>._M_i = 0xfffffffffffffffe;
        _Var4 = prior_epoch_local;
      }
      UNLOCK();
      if (!local_31) {
        prior_epoch_local = _Var4;
      }
    }
  }
  bVar3 = local_31;
  if (local_31 != false) {
    p_Var1 = this->callback;
    pIVar2 = this->context;
    this->callback = new_callback;
    this->context = new_context;
    local_6c = 5;
    ___b = (EpochAction *)prior_epoch;
    local_60 = this;
    local_18 = &prior_epoch_local;
    local_10 = this;
    local_70 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    this_local = ___b;
    if (local_6c == 3) {
      (this->epoch).super___atomic_base<unsigned_long>._M_i = (__int_type)___b;
    }
    else if (local_6c == 5) {
      LOCK();
      (this->epoch).super___atomic_base<unsigned_long>._M_i = (__int_type)___b;
      UNLOCK();
    }
    else {
      (this->epoch).super___atomic_base<unsigned_long>._M_i = (__int_type)___b;
    }
    (*p_Var1)(pIVar2);
  }
  return bVar3;
}

Assistant:

bool TrySwap(uint64_t expected_epoch, uint64_t prior_epoch, callback_t new_callback,
                 IAsyncContext* new_context) {
      bool retval = epoch.compare_exchange_strong(expected_epoch, kLocked);
      if(retval) {
        callback_t existing_callback = callback;
        IAsyncContext* existing_context = context;
        callback = new_callback;
        context = new_context;
        // Release the lock.
        epoch.store(prior_epoch);
        // Perform the action.
        existing_callback(existing_context);
      }
      return retval;
    }